

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O2

void __thiscall QWidgetWindowPrivate::setVisible(QWidgetWindowPrivate *this,bool visible)

{
  long lVar1;
  long lVar2;
  char cVar3;
  QLoggingCategory *pQVar4;
  QDebug *pQVar5;
  long in_FS_OFFSET;
  QDebug local_50;
  Stream *local_48;
  undefined1 local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&this->field_0x8;
  pQVar4 = QtPrivateLogging::lcWidgetShowHide();
  if (((pQVar4->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
    QMessageLogger::debug();
    pQVar5 = QDebug::operator<<(&local_50,"Setting visibility of");
    local_48 = pQVar5->stream;
    *(int *)(local_48 + 0x28) = *(int *)(local_48 + 0x28) + 1;
    ::operator<<((Stream *)local_40,(QWidget *)&local_48);
    pQVar5 = QDebug::operator<<((QDebug *)local_40,"to");
    pQVar5 = QDebug::operator<<(pQVar5,visible);
    QDebug::operator<<(pQVar5,"via QWidgetWindowPrivate");
    QDebug::~QDebug((QDebug *)local_40);
    QDebug::~QDebug((QDebug *)&local_48);
    QDebug::~QDebug(&local_50);
  }
  lVar2 = *(long *)(lVar1 + 0x28);
  if ((((lVar2 != 0) && (*(int *)(lVar2 + 4) != 0)) && (lVar1 = *(long *)(lVar1 + 0x30), lVar1 != 0)
      ) && ((bool)(*(byte *)(*(long *)(lVar1 + 0x20) + 9) >> 7) != visible)) {
    (**(code **)(**(long **)(lVar1 + 8) + 0x20))(*(long **)(lVar1 + 8),visible);
  }
  cVar3 = QWindow::isVisible();
  if ((bool)cVar3 != visible) {
    QWindowPrivate::setVisible(SUB81(this,0));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void setVisible(bool visible) override
    {
        Q_Q(QWidgetWindow);
        qCDebug(lcWidgetShowHide) << "Setting visibility of" << q->widget()
               << "to" << visible << "via QWidgetWindowPrivate";

        if (QWidget *widget = q->widget()) {
            // If the widget's visible state is already matching the new QWindow
            // visible state we assume the widget has already synced up.
            if (visible != widget->isVisible())
                QWidgetPrivate::get(widget)->setVisible(visible);
        }

        // If we end up calling QWidgetPrivate::setVisible() above, we will
        // in most cases recurse back into setNativeWindowVisibility() to
        // update the QWindow state. But during QWidget::destroy() this is
        // not the case, as Qt::WA_WState_Created has been unset by the time
        // we check if we should call hide_helper(). We handle this case, as
        // well as the cases where we don't call QWidgetPrivate::setVisible(),
        // by syncing up the QWindow state here if needed.
        if (q->isVisible() != visible)
            QWindowPrivate::setVisible(visible);
    }